

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_websocket.hpp
# Opt level: O1

void __thiscall
m2d::savanna::async_websocket::raw_stream_logic::on_resolve_l
          (raw_stream_logic *this,error_code ec,results_type *results)

{
  element_type *peVar1;
  any_endpoint local_52;
  run_connect_range_op local_51;
  element_type *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_48;
  bind_front_wrapper<void_(m2d::savanna::async_websocket::interface::*)(boost::system::error_code,_boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>),_std::shared_ptr<m2d::savanna::async_websocket::interface>_>
  local_40;
  
  peVar1 = (((this->raw_stream_).
             super___shared_ptr<boost::beast::websocket::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_true>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->impl_).px;
  if (peVar1 != (element_type *)0x0) {
    boost::beast::
    basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>
    ::expires_after(&(peVar1->
                     super_empty_value<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_0U,_false>
                     ).value_,(duration)0x1bf08eb000);
    peVar1 = (((this->raw_stream_).
               super___shared_ptr<boost::beast::websocket::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_true>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->impl_).px;
    if (peVar1 != (element_type *)0x0) {
      std::__shared_ptr<m2d::savanna::async_websocket::interface,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<m2d::savanna::async_websocket::interface,void>
                ((__shared_ptr<m2d::savanna::async_websocket::interface,(__gnu_cxx::_Lock_policy)2>
                  *)&local_50,
                 (__weak_ptr<m2d::savanna::async_websocket::interface,_(__gnu_cxx::_Lock_policy)2> *
                 )&(this->super_interface).
                   super_enable_shared_from_this<m2d::savanna::async_websocket::interface>);
      local_40.h_ = (offset_in_interface_to_subr)async_websocket::interface::on_connect;
      local_40._8_8_ = 0;
      local_40.args_.
      super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL>,_std::shared_ptr<m2d::savanna::async_websocket::interface>_>
      .super_tuple_element_impl<0UL,_std::shared_ptr<m2d::savanna::async_websocket::interface>_>.t.
      super___shared_ptr<m2d::savanna::async_websocket::interface,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = local_50;
      local_40.args_.
      super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL>,_std::shared_ptr<m2d::savanna::async_websocket::interface>_>
      .super_tuple_element_impl<0UL,_std::shared_ptr<m2d::savanna::async_websocket::interface>_>.t.
      super___shared_ptr<m2d::savanna::async_websocket::interface,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Stack_48;
      local_50 = (element_type *)0x0;
      p_Stack_48 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      boost::beast::
      basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>
      ::ops::run_connect_range_op::operator()
                (&local_51,&local_40,
                 &(peVar1->
                  super_empty_value<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_0U,_false>
                  ).value_,results,&local_52);
      if (local_40.args_.
          super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL>,_std::shared_ptr<m2d::savanna::async_websocket::interface>_>
          .super_tuple_element_impl<0UL,_std::shared_ptr<m2d::savanna::async_websocket::interface>_>
          .t.
          super___shared_ptr<m2d::savanna::async_websocket::interface,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_40.args_.
                   super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL>,_std::shared_ptr<m2d::savanna::async_websocket::interface>_>
                   .
                   super_tuple_element_impl<0UL,_std::shared_ptr<m2d::savanna::async_websocket::interface>_>
                   .t.
                   super___shared_ptr<m2d::savanna::async_websocket::interface,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (p_Stack_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_48);
      }
      return;
    }
  }
  __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,
                "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<boost::beast::websocket::stream<boost::beast::basic_stream<boost::asio::ip::tcp>>::impl_type>::operator->() const [T = boost::beast::websocket::stream<boost::beast::basic_stream<boost::asio::ip::tcp>>::impl_type]"
               );
}

Assistant:

void on_resolve_l(beast::error_code ec, tcp::resolver::results_type results) override
			{
				beast::get_lowest_layer(*raw_stream_).expires_after(std::chrono::seconds(120));
				beast::get_lowest_layer(*raw_stream_).async_connect(results, beast::bind_front_handler(&interface::on_connect, this->shared_from_this()));
			}